

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Graph.cpp
# Opt level: O3

Vertex * __thiscall Graph::greedyCapacitorAllocation(Graph *this)

{
  Vertex *pVVar1;
  double dVar2;
  Edge *pEVar3;
  Edge *pEVar4;
  Edge *pEVar5;
  double dVar6;
  
  pVVar1 = this->verticesList;
  while( true ) {
    if (pVVar1 == (Vertex *)0x0) {
      return (Vertex *)0x0;
    }
    pEVar4 = pVVar1->edgesList;
    dVar6 = pEVar4->reactivePowerFlow;
    for (pEVar5 = pEVar4->nextEdge; pEVar5 != (Edge *)0x0; pEVar5 = pEVar5->nextEdge) {
      dVar2 = pEVar5->reactivePowerFlow;
      pEVar3 = pEVar5;
      if (pEVar5->reactivePowerFlow <= dVar6) {
        dVar2 = dVar6;
        pEVar3 = pEVar4;
      }
      pEVar4 = pEVar3;
      dVar6 = dVar2;
    }
    if (ABS(dVar6) < 1e-07) break;
    pVVar1 = pEVar4->destiny;
  }
  return pVVar1;
}

Assistant:

Vertex *Graph::greedyCapacitorAllocation(){
    double tol = 1e-7;
    Vertex *vertex = this->verticesList;
    while(vertex != NULL){
//        cout << endl << " Origin  Vertex #" << vertex->getID() << endl << " Destinations |";
        Edge *edgeChoice = vertex->getEdgesList();
        double criteria = edgeChoice->getReactivePowerFlow();
//        cout << " Vertex #" << edgeChoice->getDestiny()->getID() << ": " << edgeChoice->getReactivePowerFlow() << "\t|";
        for( Edge *e = edgeChoice->getNext(); e != NULL; e = e->getNext()) {
//            cout << " Vertex #" << e->getDestiny()->getID() << ": " << e->getReactivePowerFlow() << "\t|";
            if( (criteria) < (e->getReactivePowerFlow()) ){
                edgeChoice = e;
                criteria = edgeChoice->getReactivePowerFlow();
            }

        }
//        cout << endl << " BEST #" << edgeChoice->getDestiny()->getID() << ":    " << edgeChoice->getReactivePowerFlow() << endl;
        if( fabs(criteria) < tol) break;
        vertex = edgeChoice->getDestiny();
    }
//    cout <<  "              ALLOCATION VERTEX #" << vertex->getID() << endl;
    return vertex;
}